

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall cmGeneratorTarget::HasSOName(cmGeneratorTarget *this,string *config)

{
  TargetType TVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  bool bVar3;
  LinkClosure *pLVar4;
  char *pcVar5;
  bool bVar6;
  string local_68;
  string local_48;
  
  TVar1 = this->Target->TargetTypeValue;
  if (TVar1 == SHARED_LIBRARY) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    local_48.field_2._M_allocated_capacity = 0x4d414e4f535f4f4e;
    local_48.field_2._8_2_ = 0x45;
    local_48._M_string_length = 9;
    bVar3 = cmTarget::GetPropertyAsBool(this->Target,&local_48);
    if (!bVar3) {
      this_00 = this->Makefile;
      pLVar4 = GetLinkClosure(this,config);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      pcVar2 = (pLVar4->LinkerLanguage)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar2,pcVar2 + (pLVar4->LinkerLanguage)._M_string_length);
      pcVar5 = cmMakefile::GetSONameFlag(this_00,&local_68);
      bVar6 = pcVar5 != (char *)0x0;
      bVar3 = true;
      goto LAB_0038a156;
    }
  }
  bVar3 = false;
  bVar6 = false;
LAB_0038a156:
  if ((bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2)) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((TVar1 == SHARED_LIBRARY) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2)) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool cmGeneratorTarget::HasSOName(const std::string& config) const
{
  // soname is supported only for shared libraries and modules,
  // and then only when the platform supports an soname flag.
  return ((this->GetType() == cmStateEnums::SHARED_LIBRARY) &&
          !this->GetPropertyAsBool("NO_SONAME") &&
          this->Makefile->GetSONameFlag(this->GetLinkerLanguage(config)));
}